

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O1

void __thiscall
cnn::HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder
          (HierarchicalSoftmaxBuilder *this,uint rep_dim,string *cluster_file,Dict *word_dict,
          Model *model)

{
  Cluster *this_00;
  
  (this->super_FactoredSoftmaxBuilder)._vptr_FactoredSoftmaxBuilder =
       (_func_int **)&PTR_new_graph_002ab3f0;
  (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->path_symbols).unk_id = -1;
  (this->path_symbols).words_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_symbols).words_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_symbols).words_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->path_symbols).d_._M_h._M_buckets = &(this->path_symbols).d_._M_h._M_single_bucket;
  (this->path_symbols).d_._M_h._M_bucket_count = 1;
  (this->path_symbols).d_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->path_symbols).d_._M_h._M_element_count = 0;
  (this->path_symbols).d_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->path_symbols).d_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->path_symbols).d_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = ReadClusterFile(this,cluster_file,word_dict);
  this->root = this_00;
  Cluster::initialize(this_00,rep_dim,model);
  return;
}

Assistant:

HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder(unsigned rep_dim,
                             const std::string& cluster_file,
                             Dict* word_dict,
                             Model* model) {
  root = ReadClusterFile(cluster_file, word_dict);
  root->initialize(rep_dim, model);
}